

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

int64_t __thiscall
llvm::DataExtractor::getSigned(DataExtractor *this,uint64_t *offset_ptr,uint32_t byte_size)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t byte_size_local;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  switch(byte_size) {
  case 1:
    uVar1 = getU8(this,offset_ptr,(Error *)0x0);
    this_local = (DataExtractor *)(long)(char)uVar1;
    break;
  case 2:
    uVar2 = getU16(this,offset_ptr,(Error *)0x0);
    this_local = (DataExtractor *)(long)(short)uVar2;
    break;
  default:
    llvm_unreachable_internal
              ("getSigned unhandled case!",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
               ,0x97);
  case 4:
    uVar3 = getU32(this,offset_ptr,(Error *)0x0);
    this_local = (DataExtractor *)(long)(int)uVar3;
    break;
  case 8:
    this_local = (DataExtractor *)getU64(this,offset_ptr,(Error *)0x0);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
DataExtractor::getSigned(uint64_t *offset_ptr, uint32_t byte_size) const {
  switch (byte_size) {
  case 1:
    return (int8_t)getU8(offset_ptr);
  case 2:
    return (int16_t)getU16(offset_ptr);
  case 4:
    return (int32_t)getU32(offset_ptr);
  case 8:
    return (int64_t)getU64(offset_ptr);
  }
  llvm_unreachable("getSigned unhandled case!");
}